

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O3

vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
optimization::common_expr_del::BlockNodes::cast_operands_abi_cxx11_
          (vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,BlockNodes *this,
          vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *value)

{
  pointer pVVar1;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar2;
  mapped_type *pmVar3;
  variant_alternative_t<0UL,_variant<int,_VarId>_> *pvVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  pointer pVVar7;
  VarId var;
  anon_class_1_0_00000001 local_c1;
  vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
  *local_c0;
  _Rb_tree_header *local_b8;
  map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
  *local_b0;
  key_type local_a8;
  _Variadic_union<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  byte local_78;
  undefined1 local_70 [16];
  uint local_60;
  undefined1 local_58;
  undefined2 local_57;
  undefined **local_50;
  variant<int,_mir::inst::VarId> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar7 = (value->super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1 = (value->super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_c0 = (vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
              *)__return_storage_ptr__;
  if (pVVar7 != pVVar1) {
    local_b0 = &this->var_map;
    local_b8 = &(this->var_map)._M_t._M_impl.super__Rb_tree_header;
    do {
      local_48.super__Variant_base<int,_mir::inst::VarId>.
      super__Move_assign_alias<int,_mir::inst::VarId>.
      super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>.
      super__Copy_ctor_alias<int,_mir::inst::VarId>.
      super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = pVVar7->field_0x18;
      local_98._0_8_ = &local_48;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
        ::_S_vtable._M_arr
        [(long)(char)local_48.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                ((anon_class_8_1_a78179b7_conflict *)&local_98,
                 (variant<int,_mir::inst::VarId> *)&pVVar7->field_0x8);
      local_50 = &PTR_display_001ecf98;
      local_48.super__Variant_base<int,_mir::inst::VarId>.
      super__Move_assign_alias<int,_mir::inst::VarId>.
      super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>.
      super__Copy_ctor_alias<int,_mir::inst::VarId>.
      super__Variant_storage_alias<int,_mir::inst::VarId>._17_1_ = pVVar7->shift;
      local_48.super__Variant_base<int,_mir::inst::VarId>.
      super__Move_assign_alias<int,_mir::inst::VarId>.
      super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>.
      super__Copy_ctor_alias<int,_mir::inst::VarId>.
      super__Variant_storage_alias<int,_mir::inst::VarId>._18_1_ = pVVar7->shift_amount;
      if (local_48.super__Variant_base<int,_mir::inst::VarId>.
          super__Move_assign_alias<int,_mir::inst::VarId>.
          super__Copy_assign_alias<int,_mir::inst::VarId>.
          super__Move_ctor_alias<int,_mir::inst::VarId>.
          super__Copy_ctor_alias<int,_mir::inst::VarId>.
          super__Variant_storage_alias<int,_mir::inst::VarId>._M_index == '\0') {
        pvVar4 = std::get<0ul,int,mir::inst::VarId>(&local_48);
        local_98._M_first._M_storage = (_Uninitialized<int,_true>)*pvVar4;
        local_78 = 0;
        std::
        vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
        ::emplace_back<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>
                  (local_c0,(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_98._M_first);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_78]._M_data)
                  ((anon_class_1_0_00000001 *)&local_a8,
                   (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98._M_first);
      }
      else {
        pvVar2 = std::get<1ul,int,mir::inst::VarId>(&local_48);
        local_a8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        local_a8.id = pvVar2->id;
        p_Var5 = (this->var_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = local_b8;
        if (p_Var5 == (_Base_ptr)0x0) {
LAB_00129913:
          local_70._8_8_ = &PTR_display_001eb100;
          local_58 = 1;
          local_70._0_8_ = &PTR_display_001ecf98;
          local_57._0_1_ = Lsl;
          local_57._1_1_ = '\0';
          local_60 = local_a8.id;
          add_leaf_node(this,(Value *)local_70);
        }
        else {
          do {
            if (*(uint *)((long)(p_Var5 + 1) + 8) >= local_a8.id) {
              p_Var6 = (_Rb_tree_header *)p_Var5;
            }
            p_Var5 = (&p_Var5->_M_left)[*(uint *)((long)(p_Var5 + 1) + 8) < local_a8.id];
          } while (p_Var5 != (_Base_ptr)0x0);
          if ((p_Var6 == local_b8) || (local_a8.id < *(uint *)(p_Var6 + 1))) goto LAB_00129913;
        }
        pmVar3 = std::
                 map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
                 ::operator[](local_b0,&local_a8);
        local_98._M_first._M_storage = (_Uninitialized<int,_true>)pmVar3->id;
        local_78 = 1;
        std::
        vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
        ::emplace_back<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>
                  (local_c0,(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_98._M_first);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_78]._M_data)
                  (&local_c1,
                   (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98._M_first);
      }
      pVVar7 = pVVar7 + 1;
    } while (pVVar7 != pVVar1);
  }
  return (vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_c0;
}

Assistant:

Node() : is_leaf(true) {}